

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcrypt.c
# Opt level: O2

void bcrypt_hash(uchar *key,int keybytes,uchar *salt,int saltbytes,uchar *output)

{
  BlowfishContext *ctx;
  int iVar1;
  bool bVar2;
  
  ctx = bcrypt_setup(key,keybytes,salt,saltbytes);
  builtin_memcpy(output,"cyxOmorhcitawolBhsiftawSanyDetim",0x20);
  iVar1 = 0x40;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    blowfish_lsb_encrypt_ecb(output,0x20,ctx);
  }
  blowfish_free_context(ctx);
  return;
}

Assistant:

void bcrypt_hash(const unsigned char *key, int keybytes,
                 const unsigned char *salt, int saltbytes,
                 unsigned char output[32])
{
    BlowfishContext *ctx;
    int i;

    ctx = bcrypt_setup(key, keybytes, salt, saltbytes);
    /* This was quite a nice starting string until it ran into
     * little-endian Blowfish :-/ */
    memcpy(output, "cyxOmorhcitawolBhsiftawSanyDetim", 32);
    for (i = 0; i < 64; i++) {
        blowfish_lsb_encrypt_ecb(output, 32, ctx);
    }
    blowfish_free_context(ctx);
}